

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,libtorrent::move_flags_t),std::__cxx11::string_const&,libtorrent::move_flags_t&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,move_flags_t *a_1)

{
  int iVar1;
  io_context *piVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *in_R8;
  bool bVar4;
  undefined1 local_80 [40];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38;
  io_context *local_30;
  undefined4 local_24;
  
  this_00 = (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar3 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  if ((!bVar4) &&
     (local_80._8_8_ =
           (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr, (element_type *)local_80._8_8_ != (element_type *)0x0)) {
    local_80._0_8_ = (((element_type *)local_80._8_8_)->super_torrent_hot_members).m_ses;
    piVar2 = ((session_impl *)local_80._0_8_)->m_io_context;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_80._16_8_ = this_00;
    local_80._24_8_ = f;
    local_80._32_8_ = a;
    local_58._M_p = (pointer)&local_48;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,*(undefined8 *)a_1,*(undefined8 *)(a_1 + 8) + *(undefined8 *)a_1)
    ;
    local_38 = *in_R8;
    local_24 = 0;
    local_30 = piVar2;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,libtorrent::move_flags_t),std::__cxx11::string_const&,libtorrent::move_flags_t&>(void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,libtorrent::move_flags_t),std::__cxx11::string_const&,libtorrent::move_flags_t&)const::_lambda()_1_>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_30,(type_conflict *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  local_80._0_4_ = 0x14;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_80);
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}